

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdWritePrime(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  word *pwVar1;
  ulong uVar2;
  word wVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  word *pwVar11;
  uint uVar12;
  char *pcVar13;
  ulong *puVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  word pCofTemp [64];
  char pRes [2000];
  ulong local_a08 [64];
  char local_808;
  char local_807 [2007];
  
  if (nVars < 3) {
    __assert_fail("nVars > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x414,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
  }
  cVar7 = (char)nVars;
  if (p->fSplitPrime == 0) {
    iVar5 = 2;
    if (p->fWriteTruth != 0) {
      iVar6 = p->nPos;
      pcVar16 = p->pOutput + iVar6;
      iVar10 = 1 << (cVar7 - 6U & 0x1f);
      if ((uint)nVars < 7) {
        iVar10 = 1;
      }
      puVar14 = pTruth + (long)iVar10 + -1;
      pcVar13 = pcVar16;
      if (pTruth <= puVar14) {
        uVar21 = 0xf;
        if ((uint)nVars < 6) {
          uVar21 = (ulong)(uint)~(-1 << (cVar7 - 2U & 0x1f));
        }
        lVar18 = uVar21 << 2;
        lVar19 = uVar21 + 1;
        do {
          uVar12 = (uint)(*puVar14 >> ((byte)lVar18 & 0x3c)) & 0xf;
          cVar7 = '7';
          if (uVar12 < 10) {
            cVar7 = '0';
          }
          *pcVar13 = cVar7 + (char)uVar12;
          pcVar13 = pcVar13 + 1;
          lVar20 = lVar19 + -1;
          bVar4 = 0 < lVar19;
          lVar18 = lVar18 + -4;
          lVar19 = lVar20;
        } while ((lVar20 != 0 && bVar4) ||
                (puVar14 = puVar14 + -1, lVar18 = uVar21 << 2, lVar19 = uVar21 + 1,
                pTruth <= puVar14));
        iVar6 = p->nPos;
      }
      p->nPos = ((int)pcVar13 - (int)pcVar16) + iVar6;
    }
  }
  else {
    uVar12 = 1 << (cVar7 - 6U & 0x1f);
    if ((uint)nVars < 7) {
      uVar12 = 1;
    }
    iVar5 = Dau_DsdCheck1Step(p,pTruth,nVars,p->pVarLevels);
    if (iVar5 == -2) {
      iVar5 = p->nPos;
      pcVar13 = p->pOutput + iVar5;
      puVar14 = pTruth + (long)(int)uVar12 + -1;
      pcVar16 = pcVar13;
      if (pTruth <= puVar14) {
        uVar21 = 0xf;
        if ((uint)nVars < 6) {
          uVar21 = (ulong)(uint)~(-1 << (cVar7 - 2U & 0x1f));
        }
        lVar18 = uVar21 << 2;
        lVar19 = uVar21 + 1;
        do {
          uVar12 = (uint)(*puVar14 >> ((byte)lVar18 & 0x3c)) & 0xf;
          cVar7 = '7';
          if (uVar12 < 10) {
            cVar7 = '0';
          }
          *pcVar16 = cVar7 + (char)uVar12;
          pcVar16 = pcVar16 + 1;
          lVar20 = lVar19 + -1;
          bVar4 = 0 < lVar19;
          lVar18 = lVar18 + -4;
          lVar19 = lVar20;
        } while ((lVar20 != 0 && bVar4) ||
                (puVar14 = puVar14 + -1, lVar18 = uVar21 << 2, lVar19 = uVar21 + 1,
                pTruth <= puVar14));
        iVar5 = p->nPos;
      }
      p->nPos = ((int)pcVar16 - (int)pcVar13) + iVar5;
      iVar5 = 2;
    }
    else {
      if (iVar5 == -1) {
        __assert_fail("vBest != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x41a,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      iVar6 = p->nPos;
      p->nPos = iVar6 + 1;
      p->pOutput[iVar6] = '<';
      Dau_DsdWriteVar(p,iVar5,0);
      bVar9 = (byte)iVar5;
      if (uVar12 == 1) {
        local_a08[0] = (s_Truths6[iVar5] & *pTruth) >> ((byte)(1 << (bVar9 & 0x1f)) & 0x3f) |
                       s_Truths6[iVar5] & *pTruth;
      }
      else if (iVar5 < 6) {
        if (0 < (int)uVar12) {
          uVar21 = s_Truths6[iVar5];
          uVar17 = 0;
          do {
            local_a08[uVar17] =
                 (pTruth[uVar17] & uVar21) >> ((byte)(1 << (bVar9 & 0x1f)) & 0x3f) |
                 pTruth[uVar17] & uVar21;
            uVar17 = uVar17 + 1;
          } while (uVar12 != uVar17);
        }
      }
      else if (0 < (int)uVar12) {
        bVar8 = (byte)(iVar5 + -6);
        uVar15 = 1 << (bVar8 & 0x1f);
        iVar6 = 2 << (bVar8 & 0x1f);
        uVar21 = 1;
        if (1 < (int)uVar15) {
          uVar21 = (ulong)uVar15;
        }
        puVar14 = local_a08;
        pwVar11 = pTruth;
        do {
          if (iVar5 + -6 != 0x1f) {
            uVar17 = 0;
            do {
              uVar2 = pwVar11[(long)(int)uVar15 + uVar17];
              puVar14[uVar17] = uVar2;
              puVar14[(long)(int)uVar15 + uVar17] = uVar2;
              uVar17 = uVar17 + 1;
            } while (uVar21 != uVar17);
          }
          pwVar11 = pwVar11 + iVar6;
          puVar14 = puVar14 + iVar6;
        } while (pwVar11 < pTruth + (int)uVar12);
      }
      pwVar11 = local_a08;
      iVar6 = Dau_DsdDecompose(pwVar11,nVars,0,p->fWriteTruth,&local_808);
      if (iVar6 != 0) {
        __assert_fail("nNonDecSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x427,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      if (local_808 != '\0') {
        pcVar16 = local_807;
        cVar7 = local_808;
        do {
          iVar6 = p->nPos;
          p->nPos = iVar6 + 1;
          p->pOutput[iVar6] = cVar7;
          cVar7 = *pcVar16;
          pcVar16 = pcVar16 + 1;
        } while (cVar7 != '\0');
      }
      if (uVar12 == 1) {
        local_a08[0] = (s_Truths6Neg[iVar5] & *pTruth) << ((byte)(1 << (bVar9 & 0x1f)) & 0x3f) |
                       s_Truths6Neg[iVar5] & *pTruth;
      }
      else if (iVar5 < 6) {
        if (0 < (int)uVar12) {
          uVar21 = s_Truths6Neg[iVar5];
          uVar17 = 0;
          do {
            local_a08[uVar17] =
                 (pTruth[uVar17] & uVar21) << ((byte)(1 << (bVar9 & 0x1f)) & 0x3f) |
                 pTruth[uVar17] & uVar21;
            uVar17 = uVar17 + 1;
          } while (uVar12 != uVar17);
        }
      }
      else if (0 < (int)uVar12) {
        pwVar1 = pTruth + (int)uVar12;
        bVar9 = (byte)(iVar5 + -6);
        uVar12 = 1 << (bVar9 & 0x1f);
        iVar6 = 2 << (bVar9 & 0x1f);
        uVar21 = 1;
        if (1 < (int)uVar12) {
          uVar21 = (ulong)uVar12;
        }
        puVar14 = local_a08 + (int)uVar12;
        do {
          if (iVar5 + -6 != 0x1f) {
            uVar17 = 0;
            do {
              wVar3 = pTruth[uVar17];
              pwVar11[uVar17] = wVar3;
              puVar14[uVar17] = wVar3;
              uVar17 = uVar17 + 1;
            } while (uVar21 != uVar17);
          }
          pTruth = pTruth + iVar6;
          puVar14 = puVar14 + iVar6;
          pwVar11 = pwVar11 + iVar6;
        } while (pTruth < pwVar1);
      }
      iVar5 = Dau_DsdDecompose(local_a08,nVars,0,p->fWriteTruth,&local_808);
      if (iVar5 != 0) {
        __assert_fail("nNonDecSize == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x42c,"int Dau_DsdWritePrime(Dau_Dsd_t *, word *, int *, int)");
      }
      if (local_808 != '\0') {
        pcVar16 = local_807;
        do {
          iVar5 = p->nPos;
          p->nPos = iVar5 + 1;
          p->pOutput[iVar5] = local_808;
          local_808 = *pcVar16;
          pcVar16 = pcVar16 + 1;
        } while (local_808 != '\0');
      }
      iVar5 = p->nPos;
      p->nPos = iVar5 + 1;
      p->pOutput[iVar5] = '>';
      iVar5 = 1;
    }
  }
  iVar6 = p->nPos;
  p->nPos = iVar6 + 1;
  p->pOutput[iVar6] = '{';
  uVar21 = 0;
  do {
    Dau_DsdWriteVar(p,pVars[uVar21],0);
    uVar21 = uVar21 + 1;
  } while ((uint)nVars != uVar21);
  iVar6 = p->nPos;
  p->nPos = iVar6 + 1;
  p->pOutput[iVar6] = '}';
  p->nSizeNonDec = nVars;
  return iVar5;
}

Assistant:

static inline int Dau_DsdWritePrime( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars )
{
    int v, RetValue = 2;
    assert( nVars > 2 );
    if ( p->fSplitPrime )
    {
        word pCofTemp[DAU_MAX_WORD];
        int nWords = Abc_TtWordNum(nVars);
        int vBest = Dau_DsdCheck1Step( p, pTruth, nVars, p->pVarLevels );
        assert( vBest != -1 );
        if ( vBest == -2 ) // non-dec
            p->nPos += Abc_TtWriteHexRev( p->pOutput + p->nPos, pTruth, nVars );
        else 
        {
            char pRes[DAU_MAX_STR];
            int nNonDecSize;
            // compose the result
            Dau_DsdWriteString( p, "<" );
            Dau_DsdWriteVar( p, vBest, 0 );
            // split decomposition
            Abc_TtCofactor1p( pCofTemp, pTruth, nWords, vBest );
            nNonDecSize = Dau_DsdDecompose( pCofTemp, nVars, 0, p->fWriteTruth, pRes );
            assert( nNonDecSize == 0 );
            Dau_DsdWriteString( p, pRes );
            // split decomposition
            Abc_TtCofactor0p( pCofTemp, pTruth, nWords, vBest );
            nNonDecSize = Dau_DsdDecompose( pCofTemp, nVars, 0, p->fWriteTruth, pRes );
            assert( nNonDecSize == 0 );
            Dau_DsdWriteString( p, pRes );
            Dau_DsdWriteString( p, ">" );
            RetValue = 1;
        }
    }
    else if ( p->fWriteTruth )
        p->nPos += Abc_TtWriteHexRev( p->pOutput + p->nPos, pTruth, nVars );
    Dau_DsdWriteString( p, "{" );
    for ( v = 0; v < nVars; v++ )
        Dau_DsdWriteVar( p, pVars[v], 0 );
    Dau_DsdWriteString( p, "}" );
    p->nSizeNonDec = nVars;
    return RetValue;
}